

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_Client_Subscriptions_remove(UA_Client *client,UA_UInt32 subscriptionId)

{
  uint uVar1;
  UA_Client_MonitoredItem *pUVar2;
  UA_Logger logger;
  UA_DeleteSubscriptionsRequest request_00;
  char *pcVar3;
  undefined1 local_168 [8];
  UA_DeleteSubscriptionsResponse response;
  UA_DeleteSubscriptionsRequest request;
  UA_Client_MonitoredItem *tmpmon;
  UA_Client_MonitoredItem *mon;
  UA_Client_Subscription *pUStack_28;
  UA_StatusCode retval;
  UA_Client_Subscription *sub;
  UA_UInt32 subscriptionId_local;
  UA_Client *client_local;
  
  for (pUStack_28 = (client->subscriptions).lh_first;
      (pUStack_28 != (UA_Client_Subscription *)0x0 && (pUStack_28->subscriptionID != subscriptionId)
      ); pUStack_28 = (pUStack_28->listEntry).le_next) {
  }
  if (pUStack_28 == (UA_Client_Subscription *)0x0) {
    client_local._4_4_ = 0x80280000;
  }
  else {
    tmpmon = (pUStack_28->monitoredItems).lh_first;
    do {
      if (tmpmon == (UA_Client_MonitoredItem *)0x0) {
        UA_DeleteSubscriptionsRequest_init
                  ((UA_DeleteSubscriptionsRequest *)&response.diagnosticInfos);
        request_00.requestHeader.authenticationToken.identifier.string.length =
             request.requestHeader.authenticationToken._0_8_;
        request_00.requestHeader.authenticationToken._0_8_ = response.diagnosticInfos;
        request_00.requestHeader.authenticationToken.identifier.string.data =
             (UA_Byte *)request.requestHeader.authenticationToken.identifier.string.length;
        request_00.requestHeader.timestamp =
             (UA_DateTime)request.requestHeader.authenticationToken.identifier.string.data;
        request_00.requestHeader._32_8_ = request.requestHeader.timestamp;
        request_00.requestHeader.auditEntryId.length = request.requestHeader._32_8_;
        request_00.requestHeader.auditEntryId.data =
             (UA_Byte *)request.requestHeader.auditEntryId.length;
        request_00.requestHeader._56_8_ = request.requestHeader.auditEntryId.data;
        request_00.requestHeader.additionalHeader._0_8_ = request.requestHeader._56_8_;
        request_00.requestHeader.additionalHeader.content.decoded.type =
             (UA_DataType *)request.requestHeader.additionalHeader._0_8_;
        request_00.requestHeader.additionalHeader.content.decoded.data =
             request.requestHeader.additionalHeader.content.decoded.type;
        request_00.requestHeader.additionalHeader.content._16_8_ =
             request.requestHeader.additionalHeader.content.decoded.data;
        request_00.requestHeader.additionalHeader.content.encoded.body.length =
             request.requestHeader.additionalHeader.content._16_8_;
        request_00.requestHeader.additionalHeader.content.encoded.body.data =
             (UA_Byte *)request.requestHeader.additionalHeader.content.encoded.body.length;
        request_00.subscriptionIdsSize = 1;
        request_00.subscriptionIds = &pUStack_28->subscriptionID;
        UA_Client_Service_deleteSubscriptions
                  ((UA_DeleteSubscriptionsResponse *)local_168,client,request_00);
        mon._4_4_ = response.responseHeader.timestamp._4_4_;
        if ((response.responseHeader.timestamp._4_4_ == 0) &&
           (response.responseHeader.additionalHeader.content.encoded.body.data != (UA_Byte *)0x0)) {
          mon._4_4_ = *(UA_StatusCode *)response.resultsSize;
        }
        UA_DeleteSubscriptionsResponse_deleteMembers((UA_DeleteSubscriptionsResponse *)local_168);
        if ((mon._4_4_ != 0) && (mon._4_4_ != 0x80280000)) {
          logger = (client->config).logger;
          uVar1 = pUStack_28->subscriptionID;
          pcVar3 = UA_StatusCode_name(mon._4_4_);
          UA_LOG_INFO(logger,UA_LOGCATEGORY_CLIENT,
                      "Could not remove subscription %u with error code %s",(ulong)uVar1,pcVar3);
          return mon._4_4_;
        }
        UA_Client_Subscriptions_forceDelete(client,pUStack_28);
        return 0;
      }
      pUVar2 = (tmpmon->listEntry).le_next;
      client_local._4_4_ =
           UA_Client_Subscriptions_removeMonitoredItem
                     (client,pUStack_28->subscriptionID,tmpmon->monitoredItemId);
      tmpmon = pUVar2;
    } while (client_local._4_4_ == 0);
  }
  return client_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Client_Subscriptions_remove(UA_Client *client, UA_UInt32 subscriptionId) {
    UA_Client_Subscription *sub;
    LIST_FOREACH(sub, &client->subscriptions, listEntry) {
        if(sub->subscriptionID == subscriptionId)
            break;
    }
    if(!sub)
        return UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;

    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_Client_MonitoredItem *mon, *tmpmon;
    LIST_FOREACH_SAFE(mon, &sub->monitoredItems, listEntry, tmpmon) {
        retval =
            UA_Client_Subscriptions_removeMonitoredItem(client, sub->subscriptionID,
                                                        mon->monitoredItemId);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
    }

    /* remove the subscription remotely */
    UA_DeleteSubscriptionsRequest request;
    UA_DeleteSubscriptionsRequest_init(&request);
    request.subscriptionIdsSize = 1;
    request.subscriptionIds = &sub->subscriptionID;
    UA_DeleteSubscriptionsResponse response = UA_Client_Service_deleteSubscriptions(client, request);
    retval = response.responseHeader.serviceResult;
    if(retval == UA_STATUSCODE_GOOD && response.resultsSize > 0)
        retval = response.results[0];
    UA_DeleteSubscriptionsResponse_deleteMembers(&response);

    if(retval != UA_STATUSCODE_GOOD && retval != UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID) {
        UA_LOG_INFO(client->config.logger, UA_LOGCATEGORY_CLIENT,
                    "Could not remove subscription %u with error code %s",
                    sub->subscriptionID, UA_StatusCode_name(retval));
        return retval;
    }

    UA_Client_Subscriptions_forceDelete(client, sub);
    return UA_STATUSCODE_GOOD;
}